

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_get_ihdr(spng_ctx *ctx,spng_ihdr *ihdr)

{
  uint32_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  undefined3 uVar6;
  int ret;
  spng_ihdr *ihdr_local;
  spng_ctx *ctx_local;
  
  if (ctx == (spng_ctx *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,1);
    if (ctx_local._4_4_ == 0) {
      if (ihdr == (spng_ihdr *)0x0) {
        ctx_local._4_4_ = 1;
      }
      else {
        uVar1 = (ctx->ihdr).height;
        ihdr->width = (ctx->ihdr).width;
        ihdr->height = uVar1;
        uVar2 = (ctx->ihdr).color_type;
        uVar3 = (ctx->ihdr).compression_method;
        uVar4 = (ctx->ihdr).filter_method;
        uVar5 = (ctx->ihdr).interlace_method;
        uVar6 = *(undefined3 *)&(ctx->ihdr).field_0xd;
        ihdr->bit_depth = (ctx->ihdr).bit_depth;
        ihdr->color_type = uVar2;
        ihdr->compression_method = uVar3;
        ihdr->filter_method = uVar4;
        ihdr->interlace_method = uVar5;
        *(undefined3 *)&ihdr->field_0xd = uVar6;
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_get_ihdr(spng_ctx *ctx, struct spng_ihdr *ihdr)
{
    if(ctx == NULL) return 1;
    int ret = read_chunks(ctx, 1);
    if(ret) return ret;
    if(ihdr == NULL) return 1;

    *ihdr = ctx->ihdr;

    return 0;
}